

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BaseVertexGroup::init
          (BaseVertexGroup *this,EVP_PKEY_CTX *ctx)

{
  int *value;
  undefined8 uVar1;
  int extraout_EAX;
  DrawTest *this_00;
  long lVar2;
  IndexType type;
  IndexType type_00;
  char *__rhs;
  undefined8 *puVar3;
  IndexTest *pIVar4;
  allocator<char> local_1a1;
  BaseVertexGroup *local_1a0;
  int *local_198;
  long local_190;
  string desc;
  string iterationDesc;
  string local_148;
  string name;
  DrawTestSpec spec;
  string local_b8;
  IndexTest tests [6];
  
  puVar3 = &DAT_0085ca20;
  pIVar4 = tests;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *puVar3;
    pIVar4->positiveBase = (bool)(char)uVar1;
    *(int3 *)&pIVar4->field_0x1 = (int3)((ulong)uVar1 >> 8);
    pIVar4->type = (int)((ulong)uVar1 >> 0x20);
    puVar3 = puVar3 + 1;
    pIVar4 = (IndexTest *)pIVar4->baseVertex;
  }
  gls::DrawTestSpec::DrawTestSpec(&spec);
  local_1a0 = this;
  genBasicSpec(&spec,this->m_method);
  spec.indexStorage = STORAGE_BUFFER;
  local_198 = tests[0].baseVertex;
  lVar2 = 0;
  while (lVar2 != 6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iterationDesc,"index_",(allocator<char> *)&local_b8);
    __rhs = "neg_";
    if (tests[lVar2].positiveBase != false) {
      __rhs = SSBOArrayLengthTests::init::arraysSized + 1;
    }
    local_190 = lVar2;
    std::operator+(&desc,&iterationDesc,__rhs);
    gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_148,(DrawTestSpec *)(ulong)tests[lVar2].type,type);
    std::operator+(&name,&desc,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&iterationDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iterationDesc,"index ",(allocator<char> *)&local_b8);
    gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_148,(DrawTestSpec *)(ulong)tests[lVar2].type,type_00);
    std::operator+(&desc,&iterationDesc,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&iterationDesc);
    this_00 = (DrawTest *)operator_new(0x138);
    gls::DrawTest::DrawTest
              (this_00,(local_1a0->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_1a0->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    spec.indexType = tests[lVar2].type;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"base vertex ",&local_1a1);
      value = (int *)((long)local_198 + lVar2);
      de::toString<int>(&local_b8,value);
      std::operator+(&iterationDesc,&local_148,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_148);
      spec.baseVertex = *value;
      gls::DrawTest::addIteration(this_00,&spec,iterationDesc._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&iterationDesc);
    }
    tcu::TestNode::addChild((TestNode *)local_1a0,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    local_198 = local_198 + 4;
    lVar2 = local_190 + 1;
  }
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&spec.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void BaseVertexGroup::init (void)
{
	struct IndexTest
	{
		bool							positiveBase;
		gls::DrawTestSpec::IndexType	type;
		int								baseVertex[2];
	};

	const IndexTest tests[] =
	{
		{ true,  gls::DrawTestSpec::INDEXTYPE_BYTE,		{  1,  2 } },
		{ true,  gls::DrawTestSpec::INDEXTYPE_SHORT,	{  1,  2 } },
		{ true,  gls::DrawTestSpec::INDEXTYPE_INT,		{  1,  2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_BYTE,		{ -1, -2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_SHORT,	{ -1, -2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_INT,		{ -1, -2 } },
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	spec.indexStorage = gls::DrawTestSpec::STORAGE_BUFFER;

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&	indexTest	= tests[testNdx];

		const std::string	name		= std::string("index_") + (indexTest.positiveBase ? "" : "neg_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string	desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		gls::DrawTest*		test		= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.indexType			= indexTest.type;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.baseVertex); ++iterationNdx)
		{
			const std::string iterationDesc = std::string("base vertex ") + de::toString(indexTest.baseVertex[iterationNdx]);
			spec.baseVertex	= indexTest.baseVertex[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		addChild(test);
	}
}